

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ThreadSafeArena::CleanupList(ThreadSafeArena *this)

{
  bool bVar1;
  SerialArenaChunk *pSVar2;
  string *psVar3;
  SerialArenaChunk *this_00;
  long lVar4;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar5;
  SerialArena *serial;
  SerialArena *local_50;
  ThreadSafeArena *local_48;
  void *local_40 [2];
  
  this_00 = (this->head_)._M_b._M_p;
  local_48 = this;
  do {
    bVar1 = SerialArenaChunk::IsSentry(this_00);
    if (bVar1) {
      SerialArena::CleanupList(&local_48->first_arena_);
      return;
    }
    pSVar2 = SerialArenaChunk::next_chunk(this_00);
    SVar5 = SerialArenaChunk::arenas(this_00);
    for (lVar4 = SVar5.len_ << 3; this_00 = pSVar2, lVar4 != 0; lVar4 = lVar4 + -8) {
      local_50 = *(SerialArena **)((long)&SVar5.ptr_[-1]._M_b._M_p + lVar4);
      local_40[0] = (void *)0x0;
      psVar3 = absl::lts_20240722::log_internal::
               Check_NEImpl<google::protobuf::internal::SerialArena*,decltype(nullptr)>
                         (&local_50,local_40,"serial != nullptr");
      if (psVar3 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
                   ,0x3a1,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      SerialArena::CleanupList(local_50);
    }
  } while( true );
}

Assistant:

void ThreadSafeArena::CleanupList() {
#ifdef PROTOBUF_ASAN
  UnpoisonAllArenaBlocks();
#endif

  WalkSerialArenaChunk([](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last.
    // Destroying in reverse-order to the construction is often assumed by users
    // and required not to break inter-object dependencies. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      serial->CleanupList();
    }
  });
  // First arena must be cleaned up last. (b/247560530)
  first_arena_.CleanupList();
}